

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_folding.cpp
# Opt level: O1

void skiwi::anon_unknown_26::fold_fixnum_to_flonum(PrimitiveCall *p,Expression *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Expression *e_00;
  bool bVar3;
  Fixnum f1;
  Literal lit1;
  Flonum f;
  Fixnum local_118;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_d0;
  undefined1 local_70;
  Flonum local_68;
  
  e_00 = (p->arguments).
         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(p->arguments).
            super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)e_00 == 0xf0) {
    local_d0._32_8_ = local_d0._M_first._M_storage._M_storage + 0x30;
    local_d0._0_8_ = 0xffffffffffffffff;
    local_d0._M_first._M_storage._M_storage[9] = '\0';
    local_d0._16_8_ = 0;
    local_d0._24_8_ = 0;
    local_d0._40_8_ = 0;
    local_d0._M_first._M_storage._M_storage[0x30] = '\0';
    local_70 = 0;
    paVar1 = &local_118.filename.field_2;
    local_118.line_nr = -1;
    local_118.column_nr = -1;
    local_118.tail_position = false;
    local_118.pre_scan_index = 0;
    local_118.scan_index = 0;
    local_118.filename._M_string_length = 0;
    local_118.filename.field_2._M_local_buf[0] = '\0';
    local_118.filename._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = is_literal((Literal *)&local_d0._M_first,e_00);
    if (bVar3) {
      bVar3 = is_fixnum(&local_118,(Literal *)&local_d0._M_first);
      if (bVar3) {
        local_68.value = (double)local_118.value;
        paVar2 = &local_68.filename.field_2;
        local_68.line_nr = -1;
        local_68.column_nr = -1;
        local_68.tail_position = false;
        local_68.pre_scan_index = 0;
        local_68.scan_index = 0;
        local_68.filename._M_string_length = 0;
        local_68.filename.field_2._M_local_buf[0] = '\0';
        local_68.filename._M_dataplus._M_p = (pointer)paVar2;
        std::
        variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
        ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     *)e,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.filename._M_dataplus._M_p != paVar2) {
          operator_delete(local_68.filename._M_dataplus._M_p,
                          CONCAT71(local_68.filename.field_2._M_allocated_capacity._1_7_,
                                   local_68.filename.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_118.filename._M_dataplus._M_p,
                      CONCAT71(local_118.filename.field_2._M_allocated_capacity._1_7_,
                               local_118.filename.field_2._M_local_buf[0]) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_d0._M_first);
    return;
  }
  __assert_fail("p.arguments.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/constant_folding.cpp"
                ,0x4f5,
                "void skiwi::(anonymous namespace)::fold_fixnum_to_flonum(PrimitiveCall &, Expression &)"
               );
}

Assistant:

void fold_fixnum_to_flonum(PrimitiveCall& p, Expression& e)
    {
    assert(p.arguments.size() == 1);
    Literal lit1;
    Fixnum f1;
    if (is_literal(lit1, p.arguments[0]))
      {
      if (is_fixnum(f1, lit1))
        {
        e = make_flonum((double)f1.value);
        }
      }
    }